

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkCollectNewTfi2_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfiNew)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  iVar1 = Acb_ObjIsTravIdPrev(p,iObj);
  iVar2 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar2 != 0) {
    return;
  }
  if (iVar1 != 0) {
    iVar1 = Acb_ObjIsCi(p,iObj);
    if (iVar1 == 0) {
      piVar3 = Acb_ObjFanins(p,iObj);
      for (lVar4 = 0; lVar4 < *piVar3; lVar4 = lVar4 + 1) {
        Acb_NtkCollectNewTfi2_rec(p,piVar3[lVar4 + 1],vTfiNew);
      }
    }
  }
  Vec_IntPush(vTfiNew,iObj);
  return;
}

Assistant:

void Acb_NtkCollectNewTfi2_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfiNew )
{
    int i, iFanin, * pFanins;
    int fTravIdPrev = Acb_ObjIsTravIdPrev(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( fTravIdPrev && !Acb_ObjIsCi(p, iObj) )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, i )
            Acb_NtkCollectNewTfi2_rec( p, iFanin, vTfiNew );
    Vec_IntPush( vTfiNew, iObj );
}